

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTT.hpp
# Opt level: O1

uint32 __thiscall
Protocol::MQTT::V5::Payload<(Protocol::MQTT::Common::ControlPacketType)1>::getFilteredSize
          (Payload<(Protocol::MQTT::Common::ControlPacketType)1> *this)

{
  byte bVar1;
  ushort uVar2;
  WillMessage *pWVar3;
  uint32 uVar4;
  int iVar5;
  int iVar6;
  
  if (this->fixedHeader == (FixedField<(Protocol::MQTT::Common::ControlPacketType)1> *)0x0) {
    uVar4 = 0;
  }
  else {
    iVar5 = 0;
    if (((this->fixedHeader->super_ConnectHeaderImpl).field_2.flags & 4) != 0) {
      pWVar3 = this->willMessage;
      uVar2 = (pWVar3->willProperties).length.size;
      uVar4 = Common::VBInt::operator_cast_to_unsigned_int(&(pWVar3->willProperties).length);
      iVar5 = uVar4 + uVar2 + (uint)(pWVar3->willTopic).length + (uint)(pWVar3->willPayload).length
              + 4;
    }
    bVar1 = (this->fixedHeader->super_ConnectHeaderImpl).field_2.flags;
    iVar6 = 0;
    if ((char)bVar1 < '\0') {
      iVar6 = (this->username).length + 2;
    }
    uVar4 = iVar6 + iVar5;
    if ((bVar1 & 0x40) != 0) {
      uVar4 = uVar4 + (this->password).length + 2;
    }
  }
  return uVar4;
}

Assistant:

uint32 getFilteredSize() const
                {
                    uint32 s = 0;
                    if (!fixedHeader) return s;
                    if (fixedHeader->willFlag)      s += willMessage->getSize();
                    if (fixedHeader->usernameFlag)  s += username.getSize();
                    if (fixedHeader->passwordFlag)  s += password.getSize();
                    return s;
                }